

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O3

void __thiscall wirehair::Codec::SetupTriangle(Codec *this)

{
  undefined1 auVar1 [64];
  uint16_t uVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  ushort uVar5;
  undefined2 uVar6;
  uint uVar7;
  uint uVar8;
  uint16_t *puVar9;
  uint8_t *puVar10;
  uint64_t *puVar11;
  bool bVar12;
  int iVar13;
  short sVar14;
  ushort uVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  
  uVar15 = this->_dense_count + this->_defer_count;
  if (uVar15 != 0) {
    auVar22 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
    auVar23 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
    auVar24 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar26 = vpmovsxbw_avx512bw(_DAT_001096a0);
    auVar27 = vpbroadcastq_avx512f(ZEXT816(0x20));
    auVar28 = vpbroadcastw_avx512bw(ZEXT216(0x20));
    puVar9 = this->_pivots;
    auVar29 = vpbroadcastq_avx512f();
    uVar19 = 0;
    do {
      vpcmpuq_avx512f(auVar25,auVar29,2);
      vpcmpuq_avx512f(auVar24,auVar29,2);
      vpcmpuq_avx512f(auVar22,auVar29,2);
      auVar25 = vpaddq_avx512f(auVar25,auVar27);
      auVar24 = vpaddq_avx512f(auVar24,auVar27);
      auVar22 = vpaddq_avx512f(auVar22,auVar27);
      vpcmpuq_avx512f(auVar23,auVar29,2);
      auVar23 = vpaddq_avx512f(auVar23,auVar27);
      auVar1 = vmovdqu16_avx512bw(auVar26);
      *(undefined1 (*) [64])(puVar9 + uVar19) = auVar1;
      uVar19 = uVar19 + 0x20;
      auVar26 = vpaddw_avx512bw(auVar26,auVar28);
    } while ((uVar15 + 0x1f & 0xffffffe0) != uVar19);
  }
  this->_next_pivot = 0;
  this->_pivot_count = (uint)uVar15;
  if (this->_first_heavy_column == 0) {
    uVar18 = this->_pivot_count;
    uVar2 = this->_defer_count;
    uVar3 = this->_dense_count;
    uVar21 = uVar18;
    if (0 < (long)(int)uVar18) {
      uVar4 = this->_mix_count;
      uVar15 = uVar3 + uVar2;
      uVar20 = (ulong)uVar18;
      uVar19 = (long)(int)uVar18;
      do {
        puVar9 = this->_pivots;
        uVar16 = uVar19 - 1;
        uVar5 = puVar9[uVar19 - 1];
        if (uVar15 <= uVar5) {
          if (this->_next_pivot <= uVar16) {
            uVar20 = (ulong)((int)uVar20 - 1);
            puVar9[uVar16] = puVar9[uVar20];
            puVar9[uVar20] = uVar5;
          }
          uVar18 = this->_first_heavy_column;
          uVar21 = (uint)(ushort)(uVar4 + uVar2);
          if (uVar18 < uVar21) {
            uVar7 = this->_ge_pitch;
            uVar8 = this->_heavy_pitch;
            puVar10 = this->_heavy_matrix;
            puVar11 = this->_ge_matrix;
            do {
              puVar10[(ulong)(uVar18 - this->_first_heavy_column) +
                      (ulong)(((uint)uVar5 - (uint)uVar15) * uVar8)] =
                   (puVar11[(ulong)(uVar5 * uVar7) + (ulong)(uVar18 >> 6)] >> ((ulong)uVar18 & 0x3f)
                   & 1) != 0;
              uVar18 = uVar18 + 1;
            } while (uVar21 != uVar18);
          }
        }
        uVar18 = (uint)uVar20;
        bVar12 = 1 < (long)uVar19;
        uVar19 = uVar16;
      } while (bVar12);
      uVar21 = this->_pivot_count;
    }
    this->_first_heavy_pivot = uVar18;
    lVar17 = 0;
    puVar9 = this->_pivots;
    do {
      sVar14 = (short)lVar17;
      uVar6 = this->_extra_count;
      iVar13 = (int)lVar17;
      lVar17 = lVar17 + 1;
      puVar9[uVar21 + iVar13] = uVar2 + uVar3 + sVar14 + uVar6;
    } while (lVar17 != 6);
    this->_pivot_count = uVar21 + 6;
    return;
  }
  return;
}

Assistant:

void Codec::SetupTriangle()
{
    CAT_IF_DUMP(cout << endl << "---- SetupTriangle ----" << endl << endl;)

    CAT_DEBUG_ASSERT((unsigned)_defer_count + (unsigned)_dense_count < 65536);
    const uint16_t pivot_count = _defer_count + _dense_count;

    // Initialize pivot array to just non-heavy rows
    for (uint16_t pivot_i = 0; pivot_i < pivot_count; ++pivot_i) {
        _pivots[pivot_i] = pivot_i;
    }

    // Set resume point to the first column
    _next_pivot = 0;
    _pivot_count = pivot_count;

    // If heavy rows are used right from the start:
    if (_first_heavy_column <= 0) {
        InsertHeavyRows();
    }
}